

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx512_gemm.h
# Opt level: O0

void intgemm::AVX512BW::Kernels8::QuantizeThread
               (float *input,int8_t *output,float quant_mult,size_t count)

{
  __m512 quant_mult_reg_00;
  undefined1 *puVar1;
  ulong in_RDX;
  long in_RSI;
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  uint in_XMM0_Da;
  __m512i asint;
  size_t i;
  size_t kBatch;
  __m512 quant_mult_reg;
  __m512i neg127;
  undefined1 local_540 [64];
  undefined1 local_500 [56];
  undefined8 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb40 [56];
  ulong local_3d0;
  float *pfStack_260;
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined2 local_5a;
  undefined1 *local_58;
  
  auVar3 = vpbroadcastd_avx512f(ZEXT416(0xffffff81));
  auVar3 = vmovdqa64_avx512f(auVar3);
  auVar3 = vmovdqa64_avx512f(auVar3);
  auVar3 = vmovdqa64_avx512f(auVar3);
  auVar4 = vbroadcastss_avx512f(ZEXT416(in_XMM0_Da));
  pfStack_260 = auVar4._32_8_;
  for (local_3d0 = 0; local_3d0 < in_RDX; local_3d0 = local_3d0 + 0x10) {
    auVar5 = vmovdqa64_avx512f(auVar4);
    vmovdqa64_avx512f(auVar5);
    quant_mult_reg_00[2] = (float)in_stack_fffffffffffffb40._0_4_;
    quant_mult_reg_00[3] = (float)in_stack_fffffffffffffb40._4_4_;
    quant_mult_reg_00[4] = (float)in_stack_fffffffffffffb40._8_4_;
    quant_mult_reg_00[5] = (float)in_stack_fffffffffffffb40._12_4_;
    quant_mult_reg_00[6] = (float)in_stack_fffffffffffffb40._16_4_;
    quant_mult_reg_00[7] = (float)in_stack_fffffffffffffb40._20_4_;
    quant_mult_reg_00[8] = (float)in_stack_fffffffffffffb40._24_4_;
    quant_mult_reg_00[9] = (float)in_stack_fffffffffffffb40._28_4_;
    quant_mult_reg_00[10] = (float)in_stack_fffffffffffffb40._32_4_;
    quant_mult_reg_00[0xb] = (float)in_stack_fffffffffffffb40._36_4_;
    quant_mult_reg_00[0xc] = (float)in_stack_fffffffffffffb40._40_4_;
    quant_mult_reg_00[0xd] = (float)in_stack_fffffffffffffb40._44_4_;
    quant_mult_reg_00[0xe] = (float)in_stack_fffffffffffffb40._48_4_;
    quant_mult_reg_00[0xf] = (float)in_stack_fffffffffffffb40._52_4_;
    quant_mult_reg_00[0] = (float)(int)in_stack_fffffffffffffb38;
    quant_mult_reg_00[1] = (float)(int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
    QuantizerGrab(pfStack_260,quant_mult_reg_00);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar3);
    auVar5 = vmovdqa64_avx512f(auVar5);
    in_stack_fffffffffffffb40 = auVar5._0_56_;
    auVar5 = vmovdqa64_avx512f(auVar6);
    local_500 = auVar5._0_56_;
    in_stack_fffffffffffffb38 = auVar5._56_8_;
    memcpy(local_1c0,local_500,0x40);
    memcpy(local_200,&stack0xfffffffffffffb40,0x40);
    auVar5 = vmovdqa64_avx512f(local_200);
    auVar6 = vmovdqa64_avx512f(local_1c0);
    local_140 = vmovdqa64_avx512f(auVar5);
    local_180 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(local_140);
    auVar6 = vmovdqa64_avx512f(local_180);
    auVar5 = vpmaxsd_avx512f(auVar5,auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    puVar1 = (undefined1 *)(in_RSI + local_3d0);
    auVar5 = vmovdqa64_avx512f(auVar5);
    local_540 = vmovdqa64_avx512f(auVar5);
    memcpy(local_100,local_540,0x40);
    auVar5 = vmovdqa64_avx512f(local_100);
    local_5a = 0xffff;
    local_c0 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(local_c0);
    auVar2 = vpmovsdb_avx512f(auVar5);
    *puVar1 = auVar2[0];
    puVar1[1] = auVar2[1];
    puVar1[2] = auVar2[2];
    puVar1[3] = auVar2[3];
    puVar1[4] = auVar2[4];
    puVar1[5] = auVar2[5];
    puVar1[6] = auVar2[6];
    puVar1[7] = auVar2[7];
    puVar1[8] = auVar2[8];
    puVar1[9] = auVar2[9];
    puVar1[10] = auVar2[10];
    puVar1[0xb] = auVar2[0xb];
    puVar1[0xc] = auVar2[0xc];
    puVar1[0xd] = auVar2[0xd];
    puVar1[0xe] = auVar2[0xe];
    puVar1[0xf] = auVar2[0xf];
    local_58 = puVar1;
  }
  return;
}

Assistant:

INTGEMM_AVX512BW static void QuantizeThread(const float *input, int8_t *output, float quant_mult, std::size_t count) {
    const __m512i neg127 = _mm512_set1_epi32(-127);
    const __m512 quant_mult_reg = _mm512_set1_ps(quant_mult);
    const std::size_t kBatch = sizeof(__m512i) / sizeof(float);
#pragma omp for
    for (std::size_t i = 0; i < count; i += kBatch) {
      __m512i asint = QuantizerGrab(input + i, quant_mult_reg);
      asint = _mm512_max_epi32(asint, neg127);
      // There doesn't seem to be an unmasked version.
      _mm512_mask_cvtsepi32_storeu_epi8(output + i, 0xffff, asint);
    }
  }